

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<long_long_const&>(String *__return_storage_ptr__,kj *this,longlong *params)

{
  kj *this_00;
  longlong *value;
  CappedArray<char,_26UL> *params_00;
  CappedArray<char,_26UL> local_40;
  kj *local_18;
  longlong *params_local;
  
  local_18 = this;
  params_local = (longlong *)__return_storage_ptr__;
  this_00 = (kj *)fwd<long_long_const&>((longlong *)this);
  toCharSequence<long_long_const&>(&local_40,this_00,value);
  _::concat<kj::CappedArray<char,26ul>>(__return_storage_ptr__,(_ *)&local_40,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}